

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SequentialPropsCmd.cpp
# Opt level: O3

int update_arg(void *field,char **orig_field,uint *field_given,uint *prev_given,char *value,
              char **possible_values,char *default_value,cmdline_parser_arg_type arg_type,
              int check_ambiguity,int override,int no_free,int multiple_option,char *long_opt,
              char short_opt,char *additional_error)

{
  uint uVar1;
  long lVar2;
  char *pcVar3;
  char *__format;
  char *pcVar4;
  double dVar5;
  undefined4 in_stack_0000002c;
  char *local_38;
  
  local_38 = (char *)0x0;
  if ((prev_given == (uint *)0x0) ||
     ((*prev_given == 0 && ((check_ambiguity == 0 || (*field_given == 0)))))) {
    if (possible_values == (char **)0x0) {
      uVar1 = 0;
    }
    else {
      if (value != (char *)0x0) {
        default_value = value;
      }
      uVar1 = check_possible_values(default_value,possible_values);
      if ((int)uVar1 < 0) {
        if ((byte)multiple_option == 0x2d) {
          pcVar3 = "invalid";
          if (uVar1 == 0xfffffffe) {
            pcVar3 = "ambiguous";
          }
          pcVar4 = "";
          __format = "%s: %s argument, \"%s\", for option `--%s\'%s\n";
        }
        else {
          pcVar4 = (char *)(ulong)(byte)multiple_option;
          pcVar3 = "invalid";
          if (uVar1 == 0xfffffffe) {
            pcVar3 = "ambiguous";
          }
          __format = "%s: %s argument, \"%s\", for option `--%s\' (`-%c\')%s\n";
        }
        fprintf(_stderr,__format,package_name,pcVar3,value,CONCAT44(in_stack_0000002c,no_free),
                pcVar4);
        goto LAB_00126d9a;
      }
    }
    if (((field_given != (uint *)0x0) && (override == 0)) && (*field_given != 0)) {
      return 0;
    }
    if (prev_given != (uint *)0x0) {
      *prev_given = *prev_given + 1;
    }
    if (field_given != (uint *)0x0) {
      *field_given = *field_given + 1;
    }
    pcVar3 = value;
    if (possible_values != (char **)0x0) {
      pcVar3 = possible_values[uVar1];
    }
    switch(arg_type) {
    case ARG_NO:
      goto switchD_00126c4c_caseD_0;
    case ARG_STRING:
      if (pcVar3 != (char *)0x0) {
        if (*field != (void *)0x0) {
          free(*field);
        }
        pcVar3 = gengetopt_strdup(pcVar3);
        *(char **)field = pcVar3;
      }
      break;
    case ARG_INT:
      if (pcVar3 != (char *)0x0) {
        lVar2 = strtol(pcVar3,&local_38,0);
        *(int *)field = (int)lVar2;
LAB_00126cb8:
        if ((local_38 == (char *)0x0) || (*local_38 != '\0')) {
          update_arg();
          goto LAB_00126d9a;
        }
      }
      break;
    case ARG_DOUBLE:
      if (pcVar3 != (char *)0x0) {
        dVar5 = strtod(pcVar3,&local_38);
        *(double *)field = dVar5;
        goto LAB_00126cb8;
      }
      break;
    case ARG_ENUM:
      if (pcVar3 != (char *)0x0) {
        *(uint *)field = uVar1;
      }
    }
    arg_type = ARG_NO;
    if (orig_field != (char **)0x0 && value != (char *)0x0) {
      if (*orig_field != (char *)0x0) {
        free(*orig_field);
      }
      pcVar3 = gengetopt_strdup(value);
      *orig_field = pcVar3;
      arg_type = ARG_NO;
    }
  }
  else {
    if ((byte)multiple_option == 0x2d) {
      update_arg();
    }
    else {
      fprintf(_stderr,"%s: `--%s\' (`-%c\') option given more than once%s\n",package_name,
              CONCAT44(in_stack_0000002c,no_free),(ulong)(byte)multiple_option,"");
    }
LAB_00126d9a:
    arg_type = ARG_STRING;
  }
switchD_00126c4c_caseD_0:
  return arg_type;
}

Assistant:

static
int update_arg(void *field, char **orig_field,
               unsigned int *field_given, unsigned int *prev_given, 
               char *value, const char *possible_values[],
               const char *default_value,
               cmdline_parser_arg_type arg_type,
               int check_ambiguity, int override,
               int no_free, int multiple_option,
               const char *long_opt, char short_opt,
               const char *additional_error)
{
  char *stop_char = 0;
  const char *val = value;
  int found;
  char **string_field;
  FIX_UNUSED (field);

  stop_char = 0;
  found = 0;

  if (!multiple_option && prev_given && (*prev_given || (check_ambiguity && *field_given)))
    {
      if (short_opt != '-')
        fprintf (stderr, "%s: `--%s' (`-%c') option given more than once%s\n", 
               package_name, long_opt, short_opt,
               (additional_error ? additional_error : ""));
      else
        fprintf (stderr, "%s: `--%s' option given more than once%s\n", 
               package_name, long_opt,
               (additional_error ? additional_error : ""));
      return 1; /* failure */
    }

  if (possible_values && (found = check_possible_values((value ? value : default_value), possible_values)) < 0)
    {
      if (short_opt != '-')
        fprintf (stderr, "%s: %s argument, \"%s\", for option `--%s' (`-%c')%s\n", 
          package_name, (found == -2) ? "ambiguous" : "invalid", value, long_opt, short_opt,
          (additional_error ? additional_error : ""));
      else
        fprintf (stderr, "%s: %s argument, \"%s\", for option `--%s'%s\n", 
          package_name, (found == -2) ? "ambiguous" : "invalid", value, long_opt,
          (additional_error ? additional_error : ""));
      return 1; /* failure */
    }
    
  if (field_given && *field_given && ! override)
    return 0;
  if (prev_given)
    (*prev_given)++;
  if (field_given)
    (*field_given)++;
  if (possible_values)
    val = possible_values[found];

  switch(arg_type) {
  case ARG_INT:
    if (val) *((int *)field) = strtol (val, &stop_char, 0);
    break;
  case ARG_DOUBLE:
    if (val) *((double *)field) = strtod (val, &stop_char);
    break;
  case ARG_ENUM:
    if (val) *((int *)field) = found;
    break;
  case ARG_STRING:
    if (val) {
      string_field = (char **)field;
      if (!no_free && *string_field)
        free (*string_field); /* free previous string */
      *string_field = gengetopt_strdup (val);
    }
    break;
  default:
    break;
  };

  /* check numeric conversion */
  switch(arg_type) {
  case ARG_INT:
  case ARG_DOUBLE:
    if (val && !(stop_char && *stop_char == '\0')) {
      fprintf(stderr, "%s: invalid numeric value: %s\n", package_name, val);
      return 1; /* failure */
    }
    break;
  default:
    ;
  };

  /* store the original value */
  switch(arg_type) {
  case ARG_NO:
    break;
  default:
    if (value && orig_field) {
      if (no_free) {
        *orig_field = value;
      } else {
        if (*orig_field)
          free (*orig_field); /* free previous string */
        *orig_field = gengetopt_strdup (value);
      }
    }
  };

  return 0; /* OK */
}